

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GreaterThanLayerParams::Clear(GreaterThanLayerParams *this)

{
  uint32_t cached_has_bits;
  GreaterThanLayerParams *this_local;
  
  this->alpha_ = 0.0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void GreaterThanLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GreaterThanLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  alpha_ = 0;
  _internal_metadata_.Clear<std::string>();
}